

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O1

void ParseBag(SFFile *sf2,FileReader *f,DWORD chunkid,DWORD chunklen)

{
  int iVar1;
  undefined8 in_RAX;
  SFBag *pSVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar3;
  long lVar4;
  pointer_____offset_0x10___ *ppuVar5;
  uint uVar6;
  ushort uVar7;
  WORD x;
  WORD x_1;
  undefined8 uStack_38;
  
  if ((chunklen & 3) == 0) {
    uVar6 = chunklen >> 2;
    uStack_38 = in_RAX;
    if (chunkid == 0x67616269) {
      if (uVar6 == sf2->Instruments[(long)sf2->NumInstruments + -1].BagIndex + 1) {
        pSVar2 = (SFBag *)operator_new__((ulong)(uVar6 * 4) * 3);
        sf2->InstrBags = pSVar2;
        sf2->NumInstrBags = uVar6;
        goto LAB_003266a4;
      }
    }
    else {
      if (chunkid != 0x67616270) {
        __assert_fail("chunkid == ID_ibag",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/timidity/instrum_sf2.cpp"
                      ,0x1f8,"void ParseBag(SFFile *, FileReader *, DWORD, DWORD)");
      }
      if (uVar6 == sf2->Presets[(long)sf2->NumPresets + -1].BagIndex + 1) {
        pSVar2 = (SFBag *)operator_new__((ulong)(uVar6 * 4) * 3);
        sf2->PresetBags = pSVar2;
        sf2->NumPresetBags = uVar6;
LAB_003266a4:
        if (chunklen != 0) {
          lVar4 = 0;
          uVar7 = 0;
          do {
            iVar1 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[2])(f,(long)&uStack_38 + 4,2);
            if (CONCAT44(extraout_var,iVar1) != 2) {
LAB_00326744:
              uVar3 = __cxa_allocate_exception(1);
              ppuVar5 = &CIOErr::typeinfo;
              goto LAB_00326768;
            }
            *(undefined2 *)((long)&pSVar2->GenIndex + lVar4) = uStack_38._4_2_;
            iVar1 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[2])(f,(long)&uStack_38 + 6,2);
            if (CONCAT44(extraout_var_00,iVar1) != 2) goto LAB_00326744;
            if ((lVar4 != 0) &&
               ((uStack_38._6_2_ < uVar7 ||
                (*(ushort *)((long)&pSVar2->GenIndex + lVar4) <
                 *(ushort *)((long)&pSVar2[-1].GenIndex + lVar4))))) goto LAB_00326757;
            (&(pSVar2->KeyRange).Lo)[lVar4] = '\0';
            (&(pSVar2->VelRange).Hi)[lVar4] = '\x7f';
            *(undefined2 *)(&(pSVar2->KeyRange).Hi + lVar4) = 0x7f;
            *(undefined4 *)((long)&pSVar2->Target + lVar4) = 0xffffffff;
            lVar4 = lVar4 + 0xc;
            uVar6 = uVar6 - 1;
            uVar7 = uStack_38._6_2_;
          } while (uVar6 != 0);
        }
        return;
      }
    }
  }
LAB_00326757:
  uVar3 = __cxa_allocate_exception(1);
  ppuVar5 = &CBadForm::typeinfo;
LAB_00326768:
  __cxa_throw(uVar3,ppuVar5,0);
}

Assistant:

static void ParseBag(SFFile *sf2, FileReader *f, DWORD chunkid, DWORD chunklen)
{
	SFBag *bags, *bag;
	WORD prev_mod = 0;
	int numbags;
	int i;

	// Section 7.3, page 22:
	//		It is always a multiple of four bytes in length, and contains one
	//		record for each preset zone plus one record for a terminal zone. ...
	//		If the PBAG sub-chunk is missing, or its size is not a multiple of
	//		four bytes, the file should be rejected as structurally unsound.
	// Section 7.7: IBAG is the same, but substitute "instrument" for "preset".
	if (chunklen & 3)
	{
		throw CBadForm();
	}

	numbags = chunklen >> 2;

	if (chunkid == ID_pbag)
	{
		if (numbags != sf2->Presets[sf2->NumPresets - 1].BagIndex + 1)
		{
			throw CBadForm();
		}
		sf2->PresetBags = bags = new SFBag[numbags];
		sf2->NumPresetBags = numbags;
	}
	else
	{
		assert(chunkid == ID_ibag);
		if (numbags != sf2->Instruments[sf2->NumInstruments - 1].BagIndex + 1)
		{
			throw CBadForm();
		}
		sf2->InstrBags = bags = new SFBag[numbags];
		sf2->NumInstrBags = numbags;
	}

	for (bag = bags, i = numbags; i != 0; --i, ++bag)
	{
		bag->GenIndex = read_uword(f);
		WORD mod = read_uword(f);
		// Section 7.3, page 22:
		//		If the generator or modulator indices are non-monotonic or do not
		//		match the size of the respective PGEN or PMOD sub-chunks, the file
		//		is structurally defective and should be rejected at load time.
		if (bag != bags)
		{
			if (bag->GenIndex < (bag - 1)->GenIndex || mod < prev_mod)
			{
				throw CBadForm();
			}
		}
		prev_mod = mod;
		bag->KeyRange.Lo = bag->VelRange.Lo = 0;
		bag->KeyRange.Hi = bag->VelRange.Hi = 127;
		bag->Target = -1;
	}
}